

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O3

int lls_qr(double *Ai,double *bi,int M,int N,double *xo)

{
  double *pdVar1;
  size_t sVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *__dest;
  void *__dest_00;
  long lVar8;
  void *__ptr;
  double *pdVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  double *pdVar15;
  int N_00;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  void *pvVar22;
  size_t sVar23;
  long lVar24;
  ulong uVar25;
  double dVar26;
  double local_c8;
  double *local_b8;
  int local_38;
  
  if (M < N) {
    lVar24 = (long)M;
    sVar23 = N * lVar24 * 8;
    pdVar3 = (double *)malloc(sVar23);
    sVar2 = lVar24 * 8;
    pdVar4 = (double *)malloc(sVar2);
    pdVar5 = (double *)malloc(sVar23);
    pdVar6 = (double *)malloc(lVar24 * sVar2);
    pdVar7 = (double *)malloc(sVar2);
    __dest = (double *)malloc(sVar2);
    if (0 < M) {
      memcpy(__dest,bi,(ulong)(uint)M << 3);
    }
    mtranspose(Ai,M,N,pdVar3);
    qrdecomp(pdVar3,N,M,pdVar4);
    getQR(pdVar3,N,M,pdVar4,pdVar5,pdVar6);
    local_38 = rank(pdVar6,M,M);
    itranspose(pdVar6,M,M);
    *pdVar7 = *__dest / *pdVar6;
    if (1 < M) {
      uVar16 = 1;
      pdVar14 = pdVar6;
      do {
        pdVar14 = pdVar14 + (uint)M;
        dVar26 = 0.0;
        uVar18 = 0;
        do {
          dVar26 = dVar26 + pdVar14[uVar18] * pdVar7[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar16 != uVar18);
        pdVar7[uVar16] = (__dest[uVar16] - dVar26) / pdVar6[uVar16 + (uint)((int)uVar16 * M)];
        uVar16 = uVar16 + 1;
      } while (uVar16 != (uint)M);
    }
    mmult(pdVar5,pdVar7,xo,N,M,1);
    free(pdVar3);
    free(pdVar4);
    free(pdVar5);
    free(pdVar6);
    free(pdVar7);
  }
  else {
    lVar24 = (long)M;
    sVar2 = lVar24 * 8;
    pdVar3 = (double *)malloc(sVar2);
    __dest_00 = malloc(sVar2);
    lVar8 = (long)N;
    sVar23 = lVar8 * 8;
    __ptr = malloc(sVar23);
    pdVar4 = (double *)malloc(sVar2);
    pdVar5 = (double *)malloc(sVar2 * lVar8);
    __dest = (double *)malloc(sVar2 * lVar8);
    pdVar6 = (double *)malloc(sVar23);
    pdVar7 = (double *)malloc(sVar23 * lVar8);
    uVar16 = (ulong)(uint)M;
    if (0 < M) {
      memcpy(__dest_00,bi,uVar16 * 8);
    }
    if (0 < N * M) {
      memcpy(__dest,Ai,(ulong)(uint)(N * M) << 3);
    }
    uVar18 = (ulong)(uint)N;
    if (N < 1) {
      local_38 = rank(pdVar7,N,N);
    }
    else {
      pdVar14 = __dest + lVar8;
      uVar20 = 0;
      pdVar15 = __dest;
      uVar21 = uVar18;
      uVar25 = uVar16;
      local_b8 = __dest;
      do {
        iVar10 = (int)uVar20;
        if ((long)uVar20 < lVar24) {
          uVar12 = 0;
          pdVar9 = pdVar15;
          do {
            pdVar3[uVar12] = *pdVar9;
            uVar12 = uVar12 + 1;
            pdVar9 = pdVar9 + lVar8;
          } while (uVar25 != uVar12);
          N_00 = M - iVar10;
          local_c8 = house(pdVar3,N_00,pdVar4);
          *(double *)((long)__ptr + uVar20 * 8) = local_c8;
          lVar13 = 0;
          pdVar9 = local_b8;
          uVar12 = uVar20;
          do {
            uVar17 = 0;
            lVar19 = lVar13;
            do {
              *(double *)((long)pdVar5 + (lVar19 >> 0x1d)) = pdVar9[uVar17];
              lVar19 = lVar19 + (uVar25 << 0x20);
              uVar17 = uVar17 + 1;
            } while (uVar21 != uVar17);
            uVar12 = uVar12 + 1;
            lVar13 = lVar13 + 0x100000000;
            pdVar9 = pdVar9 + uVar18;
          } while (uVar12 != uVar16);
        }
        else {
          N_00 = M - iVar10;
          local_c8 = house(pdVar3,N_00,pdVar4);
          *(double *)((long)__ptr + uVar20 * 8) = local_c8;
        }
        iVar10 = N - iVar10;
        mmult(pdVar5,pdVar4,pdVar6,iVar10,N_00,1);
        scale(pdVar6,iVar10,1,local_c8);
        mmult(pdVar4,pdVar6,pdVar5,N_00,1,iVar10);
        if ((long)uVar20 < lVar24) {
          lVar13 = 0;
          pdVar9 = pdVar15;
          uVar12 = uVar20;
          do {
            uVar17 = 0;
            do {
              pdVar9[uVar17] = pdVar9[uVar17] - pdVar5[(int)lVar13 + (int)uVar17];
              uVar17 = uVar17 + 1;
            } while (uVar21 != uVar17);
            uVar12 = uVar12 + 1;
            pdVar9 = pdVar9 + lVar8;
            lVar13 = lVar13 + uVar21;
          } while (uVar12 != uVar16);
        }
        uVar20 = uVar20 + 1;
        if ((long)uVar20 < lVar24) {
          uVar12 = 1;
          pdVar9 = pdVar14;
          do {
            *pdVar9 = pdVar4[uVar12];
            uVar12 = uVar12 + 1;
            pdVar9 = pdVar9 + lVar8;
          } while (uVar25 != uVar12);
        }
        uVar25 = uVar25 - 1;
        pdVar15 = pdVar15 + lVar8 + 1;
        uVar21 = uVar21 - 1;
        local_b8 = local_b8 + uVar18 + 1;
        pdVar14 = pdVar14 + lVar8 + 1;
      } while (uVar20 != uVar18);
      uVar21 = 0;
      pdVar14 = __dest;
      pdVar15 = pdVar7;
      do {
        uVar25 = 0;
        do {
          if (uVar25 < uVar21) {
            pdVar15[uVar25] = 0.0;
          }
          else {
            pdVar15[uVar25] = pdVar14[uVar25];
          }
          uVar25 = uVar25 + 1;
        } while (uVar18 != uVar25);
        uVar21 = uVar21 + 1;
        pdVar15 = pdVar15 + uVar18;
        pdVar14 = pdVar14 + uVar18;
      } while (uVar21 != uVar18);
      local_38 = rank(pdVar7,N,N);
      pdVar14 = __dest + uVar18;
      uVar21 = 0;
      pvVar22 = __dest_00;
      pdVar15 = pdVar4;
      do {
        pdVar4[uVar21] = 1.0;
        uVar25 = uVar21 + 1;
        if ((long)uVar25 < lVar24) {
          uVar20 = 1;
          pdVar9 = pdVar14;
          do {
            pdVar15[uVar20] = *pdVar9;
            uVar20 = uVar20 + 1;
            pdVar9 = pdVar9 + uVar18;
          } while (uVar16 != uVar20);
        }
        mmult((double *)((long)__dest_00 + uVar21 * 8),pdVar4 + uVar21,pdVar6,1,M - (int)uVar21,1);
        dVar26 = *pdVar6 * *(double *)((long)__ptr + uVar21 * 8);
        *pdVar6 = dVar26;
        if ((long)uVar21 < lVar24) {
          uVar21 = 0;
          do {
            pdVar15[uVar21] = pdVar15[uVar21] * dVar26;
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
          uVar21 = 0;
          do {
            *(double *)((long)pvVar22 + uVar21 * 8) =
                 *(double *)((long)pvVar22 + uVar21 * 8) - pdVar15[uVar21];
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
        }
        uVar16 = uVar16 - 1;
        pdVar15 = pdVar15 + 1;
        pdVar14 = pdVar14 + uVar18 + 1;
        pvVar22 = (void *)((long)pvVar22 + 8);
        uVar21 = uVar25;
      } while (uVar25 != uVar18);
    }
    uVar11 = N - 1;
    xo[(int)uVar11] =
         *(double *)((long)__dest_00 + (long)(int)uVar11 * 8) / pdVar7[(ulong)(uint)(N * N) - 1];
    if (1 < N) {
      uVar21 = (ulong)(N - 2);
      pdVar15 = pdVar7 + uVar21 * (uVar18 + 1) + 1;
      pdVar14 = xo + uVar11;
      uVar16 = 1;
      do {
        dVar26 = 0.0;
        if ((long)uVar21 < lVar8 + -1) {
          uVar25 = 0;
          do {
            pdVar9 = pdVar15 + uVar25;
            pdVar1 = pdVar14 + uVar25;
            uVar25 = uVar25 + 1;
            dVar26 = dVar26 + *pdVar9 * *pdVar1;
          } while (uVar16 != uVar25);
        }
        xo[uVar21] = (*(double *)((long)__dest_00 + uVar21 * 8) - dVar26) /
                     pdVar7[uVar21 * (uVar18 + 1)];
        uVar21 = uVar21 - 1;
        uVar16 = uVar16 + 1;
        pdVar15 = (double *)((long)pdVar15 - (uVar18 * 8 + 8));
        pdVar14 = pdVar14 + -1;
      } while (uVar16 != uVar18);
    }
    free(pdVar3);
    free(pdVar4);
    free(pdVar5);
    free(pdVar6);
    free(__ptr);
    free(pdVar7);
    free(__dest_00);
  }
  free(__dest);
  return local_38;
}

Assistant:

int lls_qr(double *Ai,double *bi,int M,int N,double *xo) {
	int ret;

	if (M >= N) {
		ret = lls_qr_determined(Ai,bi,M,N,xo);
	} else {
		ret = lls_qr_undetermined(Ai,bi,M,N,xo);
	}

	return ret;
}